

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void rename_bb_insn(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn)

{
  void **ppvVar1;
  char cVar2;
  size_t *psVar3;
  MIR_func_t pMVar4;
  MIR_context_t ctx;
  FILE *__stream;
  MIR_reg_t MVar5;
  MIR_type_t type;
  ssa_edge_t_conflict *__ptr;
  gen_ctx *pgVar6;
  gen_ctx *__s;
  MIR_insn_t pMVar7;
  size_t sVar8;
  char *pcVar9;
  gen_ctx *__ptr_00;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  undefined1 *puVar13;
  int iVar14;
  VARR_ssa_edge_t *pVVar15;
  ssa_ctx *psVar16;
  undefined1 extraout_DL;
  uint extraout_EDX;
  size_t sVar17;
  void *pvVar18;
  gen_ctx *unaff_RBX;
  gen_ctx_t pgVar19;
  ulong unaff_RBP;
  gen_ctx *pgVar20;
  MIR_insn_t in_R8;
  ulong in_R9;
  ssa_edge_t_conflict psVar21;
  VARR_size_t *pVVar22;
  VARR_char *pVVar23;
  long lVar24;
  uint uVar25;
  size_t sVar26;
  char *__size;
  MIR_op_t *pMVar27;
  void *pvVar28;
  size_t sVar29;
  char acStack_c0 [40];
  gen_ctx *pgStack_98;
  MIR_op_t *pMStack_90;
  size_t sStack_88;
  gen_ctx_t pgStack_80;
  void *pvStack_78;
  code *pcStack_70;
  MIR_reg_t local_5c;
  uint local_58;
  int local_54;
  MIR_op_t *local_50;
  MIR_insn_t_conflict local_48;
  ulong local_40;
  gen_ctx *local_38;
  
  local_48 = bb_insn->insn;
  local_40 = *(ulong *)&local_48->field_0x18 >> 0x20;
  if (local_40 != 0) {
    sVar26 = 0;
    local_50 = local_48->ops;
    pMVar27 = local_50;
    local_38 = (gen_ctx *)bb_insn;
    do {
      while( true ) {
        pcStack_70 = (code *)0x16119c;
        MIR_insn_op_mode(gen_ctx->ctx,local_48,sVar26,&local_54);
        pgVar20 = local_38;
        if (local_54 != 0) break;
LAB_001611c0:
        sVar26 = sVar26 + 1;
        if (local_40 <= sVar26) {
          return;
        }
      }
      if (pMVar27[sVar26].field_0x8 != '\x02') {
        if (pMVar27[sVar26].field_0x8 != '\v') {
LAB_00161463:
          pcStack_70 = (code *)0x161482;
          __assert_fail("op_ref->mode == MIR_OP_VAR",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x4ff,
                        "int output_insn_var_iterator_next(gen_ctx_t, insn_var_iterator_t *, MIR_reg_t *, int *)"
                       );
        }
        goto LAB_001611c0;
      }
      local_58 = pMVar27[sVar26].u.reg;
      if (0x21 < local_58) {
        pvVar28 = local_50[(int)sVar26].data;
        if ((pvVar28 == (void *)0x0) || (*(char *)((long)pvVar28 + 0x10) == '\0')) {
          if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
            pcStack_70 = (code *)0x16122c;
            fprintf((FILE *)gen_ctx->debug_file,"  Start def insn %-5lu",
                    (ulong)*(uint *)&local_38->field_0xc);
            pcStack_70 = (code *)0x161239;
            print_bb_insn(gen_ctx,(bb_insn_t_conflict)pgVar20,0);
            unaff_RBX = pgVar20;
          }
          pcVar9 = (char *)(ulong)local_58;
          pMVar27 = local_50 + (int)sVar26;
          pcStack_70 = (code *)0x161251;
          pgVar19 = gen_ctx;
          MVar5 = get_new_ssa_reg(gen_ctx,local_58,0x40,0);
          local_5c = MVar5;
          if (pvVar28 == (void *)0x0) {
            if (MVar5 != 0xffffffff) {
              pcStack_70 = (code *)0x16142d;
              in_R8 = local_48;
              rename_op_reg(gen_ctx,pMVar27,local_58,MVar5,local_48,(int)in_R9);
            }
          }
          else {
            pVVar15 = gen_ctx->ssa_ctx->ssa_edges_to_process;
            if ((pVVar15 == (VARR_ssa_edge_t *)0x0) || (pVVar15->varr == (ssa_edge_t_conflict *)0x0)
               ) {
              pcStack_70 = get_new_ssa_reg;
              rename_bb_insn_cold_4();
              psVar16 = pgVar19->ssa_ctx;
              pVVar22 = psVar16->curr_reg_indexes;
              pgVar20 = pgVar19;
              pgStack_98 = unaff_RBX;
              pMStack_90 = pMVar27;
              sStack_88 = sVar26;
              pgStack_80 = gen_ctx;
              pvStack_78 = pvVar28;
              pcStack_70 = (code *)unaff_RBP;
              if (pVVar22 == (VARR_size_t *)0x0) goto LAB_0016151e;
              sVar26 = (ulong)pcVar9 & 0xffffffff;
              iVar14 = (int)pcVar9;
              pvVar28 = (void *)((ulong)pcVar9 & 0xffffffff);
              goto LAB_001614b5;
            }
            pVVar15->els_num = 0;
            for (psVar21 = (ssa_edge_t_conflict)pMVar27->data; psVar21 != (ssa_edge_t_conflict)0x0;
                psVar21 = psVar21->next_use) {
              if (psVar21->flag == '\0') {
                pVVar15 = gen_ctx->ssa_ctx->ssa_edges_to_process;
                __ptr = pVVar15->varr;
                if (__ptr == (ssa_edge_t_conflict *)0x0) goto LAB_0016145e;
                sVar17 = pVVar15->els_num;
                uVar10 = sVar17 + 1;
                if (pVVar15->size < uVar10) {
                  unaff_RBP = (uVar10 >> 1) + uVar10;
                  pcStack_70 = (code *)0x1612de;
                  __ptr = (ssa_edge_t_conflict *)realloc(__ptr,unaff_RBP * 8);
                  pVVar15->varr = __ptr;
                  pVVar15->size = unaff_RBP;
                  sVar17 = pVVar15->els_num;
                  uVar10 = sVar17 + 1;
                }
                pVVar15->els_num = uVar10;
                __ptr[sVar17] = psVar21;
                psVar21->flag = '\x01';
                MVar5 = local_5c;
                if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                  in_R9 = (ulong)psVar21->use_op_num;
                  in_R8 = (MIR_insn_t)(ulong)psVar21->use->index;
                  pcStack_70 = (code *)0x161337;
                  fprintf((FILE *)gen_ctx->debug_file,
                          "     Adding ssa edge: def %lu:%d -> use %lu:%d:\n      ",
                          (ulong)psVar21->def->index,(ulong)psVar21->def_op_num);
                  pcStack_70 = (code *)0x161346;
                  print_bb_insn(gen_ctx,psVar21->def,0);
                  pcStack_70 = (code *)0x161360;
                  fwrite("     ",5,1,(FILE *)gen_ctx->debug_file);
                  pcStack_70 = (code *)0x16136e;
                  print_bb_insn(gen_ctx,psVar21->use,0);
                  MVar5 = local_5c;
                }
              }
            }
            if (MVar5 != 0xffffffff) {
              do {
                uVar25 = local_58;
                MVar5 = local_5c;
                pVVar15 = gen_ctx->ssa_ctx->ssa_edges_to_process;
                if (pVVar15 == (VARR_ssa_edge_t *)0x0) {
                  pcStack_70 = (code *)0x161459;
                  rename_bb_insn_cold_3();
LAB_00161459:
                  pcStack_70 = (code *)0x16145e;
                  rename_bb_insn_cold_2();
LAB_0016145e:
                  pcStack_70 = (code *)0x161463;
                  rename_bb_insn_cold_1();
                  goto LAB_00161463;
                }
                sVar17 = pVVar15->els_num;
                if (sVar17 == 0) break;
                if (pVVar15->varr == (ssa_edge_t_conflict *)0x0) goto LAB_00161459;
                unaff_RBX = (gen_ctx *)(ulong)local_58;
                unaff_RBP = (ulong)local_5c;
                pVVar15->els_num = sVar17 - 1;
                psVar21 = pVVar15->varr[sVar17 - 1];
                in_R8 = psVar21->use->insn;
                pMVar7 = psVar21->def->insn;
                pcStack_70 = (code *)0x1613eb;
                rename_op_reg(gen_ctx,(MIR_op_t *)
                                      ((long)&pMVar7->ops[0].data +
                                      (ulong)((uint)psVar21->def_op_num * 0x30)),local_58,local_5c,
                              pMVar7,(int)in_R9);
                pcStack_70 = (code *)0x16140b;
                rename_op_reg(gen_ctx,in_R8->ops + psVar21->use_op_num,uVar25,MVar5,in_R8,(int)in_R9
                             );
              } while( true );
            }
          }
        }
      }
      sVar26 = sVar26 + 1;
      pMVar27 = local_50;
    } while (sVar26 < local_40);
  }
  return;
  while( true ) {
    pgVar6 = (gen_ctx *)pVVar22->varr;
    if (pgVar6 == (gen_ctx *)0x0) {
      get_new_ssa_reg_cold_1();
      goto LAB_001617e2;
    }
    pcVar9 = (char *)((long)pvVar18 + 1);
    if ((void *)pVVar22->size <= pvVar18) {
      pgVar20 = pgVar6;
      pgVar6 = (gen_ctx *)realloc(pgVar6,(long)(pcVar9 + ((ulong)pcVar9 >> 1)) * 8);
      pVVar22->varr = (size_t *)pgVar6;
      pVVar22->size = (size_t)(pcVar9 + ((ulong)pcVar9 >> 1));
      pvVar18 = (void *)pVVar22->els_num;
      psVar16 = pgVar19->ssa_ctx;
      pcVar9 = (char *)((long)pvVar18 + 1);
    }
    pVVar22->els_num = (size_t)pcVar9;
    pgVar6->call_used_hard_regs[(long)pvVar18 - 0xd] = (bitmap_t)0x0;
    pVVar22 = psVar16->curr_reg_indexes;
    unaff_RBX = pgVar19;
    if (pVVar22 == (VARR_size_t *)0x0) break;
LAB_001614b5:
    pvVar18 = (void *)pVVar22->els_num;
    if (pvVar28 < pvVar18) goto LAB_00161523;
  }
LAB_0016151e:
  pgVar19 = unaff_RBX;
  iVar14 = (int)sVar26;
  get_new_ssa_reg_cold_9();
LAB_00161523:
  psVar3 = pVVar22->varr;
  if (psVar3 == (size_t *)0x0) {
LAB_001617e2:
    get_new_ssa_reg_cold_8();
LAB_001617e7:
    get_new_ssa_reg_cold_7();
LAB_001617ec:
    get_new_ssa_reg_cold_5();
LAB_001617f1:
    pMVar7 = in_R8;
    pgVar6 = pgVar20;
    iVar14 = (int)psVar16;
    get_new_ssa_reg_cold_6();
LAB_001617f6:
    get_new_ssa_reg_cold_3();
LAB_001617fb:
    get_new_ssa_reg_cold_2();
  }
  else {
    sVar26 = psVar3[(long)pvVar28];
    psVar3[(long)pvVar28] = sVar26 + 1;
    if (((int)pVVar15 == 0) && (sVar26 == 0)) {
      return;
    }
    pgVar6 = (gen_ctx *)pgVar19->ctx;
    uVar25 = iVar14 - 0x21;
    pcVar9 = (char *)(ulong)uVar25;
    pMVar4 = (pgVar19->curr_func_item->u).func;
    type = MIR_reg_type((MIR_context_t)pgVar6,uVar25,pMVar4);
    __s = (gen_ctx *)MIR_reg_name((MIR_context_t)pgVar6,uVar25,pMVar4);
    pgVar20 = pgVar6;
    pMVar7 = (MIR_insn_t)MIR_reg_hard_reg_name((MIR_context_t)pgVar6,uVar25,pMVar4);
    psVar16 = pgVar19->ssa_ctx;
    pVVar23 = psVar16->reg_name;
    if ((pVVar23 == (VARR_char *)0x0) ||
       (__ptr_00 = (gen_ctx *)pVVar23->varr, __ptr_00 == (gen_ctx *)0x0)) goto LAB_001617e7;
    pVVar23->els_num = 0;
    pgVar20 = __s;
    sVar8 = strlen((char *)__s);
    if (pVVar23->size < sVar8) {
      sVar29 = (sVar8 >> 1) + sVar8;
      pcVar9 = (char *)realloc(__ptr_00,sVar29);
      pVVar23->varr = pcVar9;
      pVVar23->size = sVar29;
      pgVar20 = __ptr_00;
LAB_0016160a:
      sVar29 = 0;
      do {
        psVar16 = (ssa_ctx *)pVVar23->els_num;
        puVar13 = (undefined1 *)((long)&psVar16->arg_bb_insns + 1);
        pVVar23->els_num = (size_t)puVar13;
        cVar2 = *(char *)((long)__s->call_used_hard_regs + (sVar29 - 0x68));
        pcVar9 = (char *)CONCAT71((int7)((ulong)puVar13 >> 8),cVar2);
        sVar29 = sVar29 + 1;
        pVVar23->varr[(long)psVar16] = cVar2;
      } while (sVar8 != sVar29);
      pVVar23 = pgVar19->ssa_ctx->reg_name;
      __ptr_00 = (gen_ctx *)pVVar23->varr;
      if (__ptr_00 != (gen_ctx *)0x0) {
        psVar16 = (ssa_ctx *)pVVar23->els_num;
        puVar13 = (undefined1 *)((long)&psVar16->arg_bb_insns + 1);
        goto LAB_0016164f;
      }
      goto LAB_001617f1;
    }
    if (sVar8 != 0) goto LAB_0016160a;
    puVar13 = &DAT_00000001;
    psVar16 = (ssa_ctx *)0x0;
LAB_0016164f:
    if ((undefined1 *)pVVar23->size < puVar13) {
      __ptr_00 = (gen_ctx *)realloc(__ptr_00,(size_t)(puVar13 + ((ulong)puVar13 >> 1)));
      pVVar23->varr = (char *)__ptr_00;
      pVVar23->size = (size_t)(puVar13 + ((ulong)puVar13 >> 1));
      psVar16 = (ssa_ctx *)pVVar23->els_num;
      puVar13 = (undefined1 *)((long)&psVar16->arg_bb_insns + 1);
    }
    pVVar23->els_num = (size_t)puVar13;
    *(undefined1 *)((long)&psVar16->arg_bb_insns + (long)(__ptr_00->call_used_hard_regs + -0xd)) =
         extraout_DL;
    pcVar9 = "%lu";
    sprintf(acStack_c0,"%lu",sVar26);
    pVVar23 = pgVar19->ssa_ctx->reg_name;
    sVar8 = strlen(acStack_c0);
    pgVar20 = (gen_ctx *)pVVar23->varr;
    if (pgVar20 == (gen_ctx *)0x0) goto LAB_001617ec;
    lVar24 = sVar8 + 1;
    uVar10 = pVVar23->els_num + lVar24;
    if (pVVar23->size < uVar10) {
      __size = (char *)((uVar10 >> 1) + uVar10);
      pcVar9 = __size;
      pcVar11 = (char *)realloc(pgVar20,(size_t)__size);
      pVVar23->varr = pcVar11;
      pVVar23->size = (size_t)__size;
    }
    if (lVar24 != 0) {
      lVar12 = 0;
      do {
        psVar16 = (ssa_ctx *)pVVar23->els_num;
        puVar13 = (undefined1 *)((long)&psVar16->arg_bb_insns + 1);
        pVVar23->els_num = (size_t)puVar13;
        pcVar11 = acStack_c0 + lVar12;
        pcVar9 = (char *)CONCAT71((int7)((ulong)puVar13 >> 8),*pcVar11);
        lVar12 = lVar12 + 1;
        pVVar23->varr[(long)psVar16] = *pcVar11;
      } while (lVar24 != lVar12);
    }
    iVar14 = (int)psVar16;
    pVVar23 = pgVar19->ssa_ctx->reg_name;
    if (pMVar7 != (MIR_insn_t)0x0) {
      if (pVVar23 == (VARR_char *)0x0) goto LAB_001617f6;
      pcVar9 = pVVar23->varr;
      MVar5 = MIR_new_global_func_reg((MIR_context_t)pgVar6,pMVar4,type,pcVar9,(char *)pMVar7);
      iVar14 = (int)pcVar9;
      pgVar20 = (gen_ctx *)pgVar19->tied_regs;
      uVar25 = MVar5 + 0x21;
      pcVar9 = (char *)((ulong)uVar25 + 1);
      pgVar6 = pgVar20;
      bitmap_expand((bitmap_t)pgVar20,(size_t)pcVar9);
      if (pgVar20 != (gen_ctx *)0x0) {
        ppvVar1 = &pgVar20->curr_func_item->data + (uVar25 >> 6);
        *ppvVar1 = (void *)((ulong)*ppvVar1 | 1L << ((ulong)uVar25 & 0x3f));
        goto LAB_001617aa;
      }
      goto LAB_001617fb;
    }
    if (pVVar23 != (VARR_char *)0x0) {
      MVar5 = MIR_new_func_reg((MIR_context_t)pgVar6,pMVar4,type,pVVar23->varr);
      uVar25 = MVar5 + 0x21;
LAB_001617aa:
      if ((uVar25 != 0xffffffff) && (pgVar19->curr_cfg->max_var < uVar25)) {
        pgVar19->curr_cfg->max_var = uVar25;
      }
      return;
    }
  }
  get_new_ssa_reg_cold_4();
  if (extraout_EDX < 0x22) {
    __assert_fail("reg > ST1_HARD_REG",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x5d8,
                  "void rename_op_reg(gen_ctx_t, MIR_op_t *, MIR_reg_t, MIR_reg_t, MIR_insn_t, int)"
                 );
  }
  ctx = pgVar6->ctx;
  if (pcVar9[8] == '\v') {
    if (*(uint *)(pcVar9 + 0x20) == extraout_EDX) {
      *(int *)(pcVar9 + 0x20) = iVar14;
      if (*(uint *)(pcVar9 + 0x24) != extraout_EDX) goto LAB_0016185e;
    }
    else if (*(uint *)(pcVar9 + 0x24) != extraout_EDX) {
      return;
    }
    *(int *)(pcVar9 + 0x24) = iVar14;
  }
  else {
    if (pcVar9[8] != '\x02') {
      return;
    }
    if (*(uint *)(pcVar9 + 0x10) != extraout_EDX) {
      return;
    }
    *(int *)(pcVar9 + 0x10) = iVar14;
  }
LAB_0016185e:
  __stream = (FILE *)pgVar6->debug_file;
  if ((__stream != (FILE *)0x0) && (1 < pgVar6->debug_level)) {
    pMVar4 = (pgVar6->curr_func_item->u).func;
    pcVar9 = MIR_reg_name(ctx,extraout_EDX - 0x21,pMVar4);
    pcVar11 = MIR_reg_name(ctx,iVar14 - 0x21,pMVar4);
    fprintf(__stream,"    Change %s to %s in insn %-5lu",pcVar9,pcVar11,
            (ulong)*(uint *)((long)pMVar7->data + 0xc));
    print_bb_insn(pgVar6,(bb_insn_t_conflict)pMVar7->data,0);
    return;
  }
  return;
}

Assistant:

static void rename_bb_insn (gen_ctx_t gen_ctx, bb_insn_t bb_insn) {
  int op_num;
  MIR_reg_t var, reg, new_reg;
  MIR_insn_t insn, def_insn, use_insn;
  ssa_edge_t ssa_edge;
  insn_var_iterator_t iter;

  insn = bb_insn->insn;
  FOREACH_OUT_INSN_VAR (gen_ctx, iter, insn, var, op_num) {
    if (var <= MAX_HARD_REG) continue;
    ssa_edge = insn->ops[op_num].data;
    if (ssa_edge != NULL && ssa_edge->flag) continue; /* already processed */
    DEBUG (2, {
      fprintf (debug_file, "  Start def insn %-5lu", (long unsigned) bb_insn->index);
      print_bb_insn (gen_ctx, bb_insn, FALSE);
    });
    reg = var;
    new_reg = get_new_ssa_reg (gen_ctx, reg, '@', FALSE);
    if (ssa_edge == NULL) { /* special case: unused output */
      if (new_reg != MIR_NON_VAR)
        rename_op_reg (gen_ctx, &insn->ops[op_num], reg, new_reg, insn, TRUE);
      continue;
    }
    VARR_TRUNC (ssa_edge_t, ssa_edges_to_process, 0);
    process_insn_to_rename (gen_ctx, insn, op_num);
    if (new_reg != MIR_NON_VAR) {
      while (pop_to_rename (gen_ctx, &ssa_edge)) {
        def_insn = ssa_edge->def->insn;
        use_insn = ssa_edge->use->insn;
        rename_op_reg (gen_ctx, &def_insn->ops[ssa_edge->def_op_num], reg, new_reg, def_insn, TRUE);
        rename_op_reg (gen_ctx, &use_insn->ops[ssa_edge->use_op_num], reg, new_reg, use_insn, TRUE);
      }
    }
  }
}